

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nested.cpp
# Opt level: O0

void gather(NS *root,
           map<N_*,_NS_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_NS_*>_>_> *all)

{
  anon_class_8_1_ba1d3501 in_RSI;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
  *in_stack_ffffffffffffffe8;
  
  NS::it((NS *)in_RSI.all);
  CIt<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,N>::
  foreach<gather(NS*,std::map<N*,NS*,std::less<N*>,std::allocator<std::pair<N*const,NS*>>>&)::__0>
            (in_stack_ffffffffffffffe8,in_RSI);
  return;
}

Assistant:

void gather(NS* root, map<N*, NS*>& all) {
    root->it().foreach([&](N* n){visit([&](auto &&data){
        if constexpr (is_same_v<decay_t<decltype(data)>, NS*>) {
            all.insert({n, data});

            cout << "subgraph cluster" << show(data) << "{" << endl;
            cout << "label=\"\";" << endl;
            cout << show(n) << " [style=invis, shape=point, margin=0];\n";
            gather(data, all);
            cout << "}" << endl;
        } else {
            all.insert({n, nullptr});
            cout << show(n) << " [label=" << *n << "];\n";
        }
    }, n->data);});
}